

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O3

TreePutResult obx::internal::mapErrorToTreePutResult(obx_err err)

{
  if (err == 0) {
    return Success;
  }
  if (err != 0x3e9) {
    if (err == 0x194) {
      return PathNotFound;
    }
    return Undefined;
  }
  return DidNotPut;
}

Assistant:

TreePutResult mapErrorToTreePutResult(obx_err err) {
    if (err == OBX_SUCCESS) {
        return TreePutResult::Success;
    } else if (err == OBX_NOT_FOUND) {
        return TreePutResult::PathNotFound;
    } else if (err == OBX_NO_SUCCESS) {
        return TreePutResult::DidNotPut;
    } else {
        return TreePutResult::Undefined;
    }
}